

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  cmCompiledGeneratorExpression *pcVar1;
  pointer pcVar2;
  _Base_ptr __n;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  string outputFileName;
  string outputContent;
  string rawCondition;
  string local_298;
  cmGeneratedFileStream fout;
  
  pcVar1 = (this->Condition).x_;
  rawCondition._M_dataplus._M_p = (pointer)&rawCondition.field_2;
  pcVar2 = (pcVar1->Input)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rawCondition,pcVar2,pcVar2 + (pcVar1->Input)._M_string_length);
  if (rawCondition._M_string_length != 0) {
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition).x_,lg,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::__cxx11::string::string((string *)&outputFileName,pcVar5,(allocator *)&fout);
    iVar4 = std::__cxx11::string::compare((char *)&outputFileName);
    if (iVar4 == 0) goto LAB_003e72cf;
    iVar4 = std::__cxx11::string::compare((char *)&outputFileName);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fout,"Evaluation file condition \"",0x1b);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&fout,rawCondition._M_dataplus._M_p,
                          rawCondition._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" did not evaluate to valid content. Got \"",0x2a);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,outputFileName._M_dataplus._M_p,outputFileName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&outputContent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputContent._M_dataplus._M_p != &outputContent.field_2) {
        operator_delete(outputContent._M_dataplus._M_p,
                        outputContent.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
      std::ios_base::~ios_base
                ((ios_base *)
                 &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
      ;
      goto LAB_003e72cf;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
      operator_delete(outputFileName._M_dataplus._M_p,
                      outputFileName.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = cmCompiledGeneratorExpression::Evaluate
                     ((this->OutputFileExpr).x_,lg,config,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::__cxx11::string::string((string *)&outputFileName,pcVar5,(allocator *)&fout);
  pcVar5 = cmCompiledGeneratorExpression::Evaluate
                     (inputExpression,lg,config,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::__cxx11::string::string((string *)&outputContent,pcVar5,(allocator *)&fout);
  bVar3 = cmsys::SystemTools::FileIsFullPath(&outputFileName);
  if (bVar3) {
    cmsys::SystemTools::CollapseFullPath((string *)&fout,&outputFileName);
  }
  else {
    FixRelativePath((string *)&fout,this,&outputFileName,PathForOutput,lg);
  }
  std::__cxx11::string::operator=((string *)&outputFileName,(string *)&fout);
  if (fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                    1);
  }
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&outputFiles->_M_t,&outputFileName);
  if ((_Rb_tree_header *)iVar7._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lg->Makefile->OutputFiles,&outputFileName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,&outputFileName);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](outputFiles,&outputFileName);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,outputFileName._M_dataplus._M_p,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,outputContent._M_dataplus._M_p,outputContent._M_string_length);
    bVar3 = cmGeneratedFileStream::Close(&fout);
    if (bVar3 && perm != 0) {
      cmsys::SystemTools::SetPermissions(outputFileName._M_dataplus._M_p,perm,false);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  }
  else {
    __n = iVar7._M_node[2]._M_parent;
    if (__n == (_Base_ptr)outputContent._M_string_length) {
      if (__n != (_Base_ptr)0x0) {
        iVar4 = bcmp(*(void **)(iVar7._M_node + 2),outputContent._M_dataplus._M_p,(size_t)__n);
        if (iVar4 != 0) goto LAB_003e7157;
      }
    }
    else {
LAB_003e7157:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fout,
                 "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                 ,0xb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fout,outputFileName._M_dataplus._M_p,outputFileName._M_string_length);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
      std::ios_base::~ios_base
                ((ios_base *)
                 &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
      ;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputContent._M_dataplus._M_p != &outputContent.field_2) {
    operator_delete(outputContent._M_dataplus._M_p,outputContent.field_2._M_allocated_capacity + 1);
  }
LAB_003e72cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
    operator_delete(outputFileName._M_dataplus._M_p,outputFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rawCondition._M_dataplus._M_p != &rawCondition.field_2) {
    operator_delete(rawCondition._M_dataplus._M_p,rawCondition.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty()) {
    std::string condResult = this->Condition->Evaluate(
      lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string outputFileName = this->OutputFileExpr->Evaluate(
    lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);
  const std::string outputContent = inputExpression->Evaluate(
    lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  std::map<std::string, std::string>::iterator it =
    outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName.c_str());
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}